

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Matcher<const_mp::NLProblemInfo_&> * testing::A<mp::NLProblemInfo_const&>(void)

{
  void *__s;
  Matcher<const_mp::NLProblemInfo_&> *in_RDI;
  MatcherInterface<const_mp::NLProblemInfo_&> *in_stack_ffffffffffffffd8;
  Matcher<const_mp::NLProblemInfo_&> *this;
  
  this = in_RDI;
  __s = operator_new(8);
  memset(__s,0,8);
  internal::AnyMatcherImpl<const_mp::NLProblemInfo_&>::AnyMatcherImpl
            ((AnyMatcherImpl<const_mp::NLProblemInfo_&> *)this);
  MakeMatcher<mp::NLProblemInfo_const&>(in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }